

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

vm_obj_id_t CVmObjList::intersect(vm_val_t *l1,vm_val_t *l2)

{
  int iVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  CVmObject *ret;
  vm_val_t *in_RDI;
  vm_val_t curval;
  vm_val_t *tmp;
  size_t residx;
  CVmObjList *reslst;
  vm_obj_id_t resobj;
  int idx;
  int cnt2;
  int cnt1;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  vm_val_t *in_stack_ffffffffffffffc8;
  vm_val_t *val;
  int local_14;
  
  local_14 = vm_val_t::ll_length(in_stack_ffffffffffffffc8);
  iVar1 = vm_val_t::ll_length(in_stack_ffffffffffffffc8);
  if (iVar1 < local_14) {
    in_stack_ffffffffffffffc8 = in_RDI;
    local_14 = iVar1;
  }
  vVar2 = create(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  ret = vm_objp(0);
  cons_clear((CVmObjList *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  val = (vm_val_t *)0x0;
  for (iVar1 = 1; iVar1 <= local_14; iVar1 = iVar1 + 1) {
    vm_val_t::ll_index((vm_val_t *)CONCAT44(iVar1,vVar2),(vm_val_t *)ret,(int)((ulong)val >> 0x20));
    iVar3 = find_in_list((vm_val_t *)ret,val,(size_t *)in_stack_ffffffffffffffc8);
    if (iVar3 != 0) {
      cons_set_element((CVmObjList *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,(vm_val_t *)0x31bbc6);
      val = (vm_val_t *)((long)&val->typ + 1);
    }
  }
  cons_set_len((CVmObjList *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  return vVar2;
}

Assistant:

vm_obj_id_t CVmObjList::intersect(VMG_ const vm_val_t *l1,
                                  const vm_val_t *l2)
{
    int cnt1;
    int cnt2;
    int idx;
    vm_obj_id_t resobj;
    CVmObjList *reslst;
    size_t residx;

    /* get the lengths of the lists */
    cnt1 = l1->ll_length(vmg0_);
    cnt2 = l2->ll_length(vmg0_);

    /* if the first list is larger than the second, swap them */
    if (cnt1 > cnt2)
    {
        /* swap the vm_val_t pointers */
        const vm_val_t *tmp = l1;
        l1 = l2;
        l2 = tmp;

        /* forget the larger count; just copy the smaller list */
        cnt1 = cnt2;
    }

    /* 
     *   Allocate our result list.  The result list can't have any more
     *   elements in it than the shorter of the two lists, whose length is
     *   now in cnt1. 
     */
    resobj = create(vmg_ FALSE, cnt1);
    reslst = (CVmObjList *)vm_objp(vmg_ resobj);
    reslst->cons_clear();

    /* we haven't put any elements in the result list yet */
    residx = 0;

    /* 
     *   for each element in the first list, find the element in the
     *   second list 
     */
    for (idx = 1 ; idx <= cnt1 ; ++idx)
    {
        vm_val_t curval;
        
        /* get this element from the first list */
        l1->ll_index(vmg_ &curval, idx);
        
        /* find the element in the second list */
        if (find_in_list(vmg_ l2, &curval, 0))
        {
            /* we found it - copy it into the result list */
            reslst->cons_set_element(residx, &curval);

            /* count the new entry in the result list */
            ++residx;
        }
    }

    /* 
     *   set the actual result length, which might be shorter than the
     *   amount we allocated 
     */
    reslst->cons_set_len(residx);

    /* return the result list */
    return resobj;
}